

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O1

int nn_xrespondent_create(void *hint,nn_sockbase **sockbase)

{
  int extraout_EAX;
  nn_xrespondent *self;
  nn_sockbase *self_00;
  
  self_00 = (nn_sockbase *)0x1b0;
  self = (nn_xrespondent *)nn_alloc_(0x1b0);
  if (self != (nn_xrespondent *)0x0) {
    nn_xrespondent_init(self,&nn_xrespondent_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_xrespondent_create_cold_1();
  nn_fq_term((nn_fq *)&self_00[2].sock);
  nn_hash_term((nn_hash *)&self_00[1].sock);
  nn_sockbase_term(self_00);
  nn_free(self_00);
  return extraout_EAX;
}

Assistant:

static int nn_xrespondent_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xrespondent *self;

    self = nn_alloc (sizeof (struct nn_xrespondent), "socket (xrespondent)");
    alloc_assert (self);
    nn_xrespondent_init (self, &nn_xrespondent_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}